

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_url_tests.cpp
# Opt level: O2

void __thiscall
common_url_tests::decode_lowercase_hex_test::test_method(decode_lowercase_hex_test *this)

{
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  string_view url_encoded;
  char *local_a0;
  char *local_98;
  undefined **local_90;
  undefined1 local_88;
  undefined1 *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/common_url_tests.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x41;
  file.m_begin = (iterator)&local_60;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_70,msg);
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_01139f30;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/common_url_tests.cpp"
  ;
  local_98 = "";
  url_encoded._M_str = "%f0%a0%b0";
  url_encoded._M_len = 9;
  UrlDecode_abi_cxx11_(&local_50,url_encoded);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (&local_90,&local_a0,0x41,1,2,&local_50,"UrlDecode(\"%f0%a0%b0\")",anon_var_dwarf_51a0ad
             ,"\"\\xf0\\xa0\\xb0\"");
  std::__cxx11::string::~string((string *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(decode_lowercase_hex_test) {
    BOOST_CHECK_EQUAL(UrlDecode("%f0%a0%b0"), "\xf0\xa0\xb0");
}